

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

opStatus __thiscall
llvm::detail::IEEEFloat::convertToInteger
          (IEEEFloat *this,MutableArrayRef<unsigned_long> parts,uint width,bool isSigned,
          roundingMode rounding_mode,bool *isExact)

{
  opStatus oVar1;
  uint bits;
  uint parts_00;
  
  oVar1 = convertToSignExtendedInteger(this,parts,width,isSigned,rounding_mode,isExact);
  if (oVar1 == opInvalidOp) {
    parts_00 = width + 0x3f >> 6;
    if (parts.super_ArrayRef<unsigned_long>.Length < (ulong)parts_00) {
      __assert_fail("dstPartsCount <= parts.size() && \"Integer too big\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x872,
                    "IEEEFloat::opStatus llvm::detail::IEEEFloat::convertToInteger(MutableArrayRef<integerPart>, unsigned int, bool, roundingMode, bool *) const"
                   );
    }
    bits = 0;
    if ((this->field_0x12 & 7) != 1) {
      if ((this->field_0x12 & 8) == 0) {
        bits = width - isSigned;
      }
      else {
        bits = (uint)isSigned;
      }
    }
    APInt::tcSetLeastSignificantBits(parts.super_ArrayRef<unsigned_long>.Data,parts_00,bits);
    if (isSigned && (this->field_0x12 & 8) != 0) {
      APInt::tcShiftLeft(parts.super_ArrayRef<unsigned_long>.Data,parts_00,width - 1);
    }
  }
  return oVar1;
}

Assistant:

IEEEFloat::opStatus
IEEEFloat::convertToInteger(MutableArrayRef<integerPart> parts,
                            unsigned int width, bool isSigned,
                            roundingMode rounding_mode, bool *isExact) const {
  opStatus fs;

  fs = convertToSignExtendedInteger(parts, width, isSigned, rounding_mode,
                                    isExact);

  if (fs == opInvalidOp) {
    unsigned int bits, dstPartsCount;

    dstPartsCount = partCountForBits(width);
    assert(dstPartsCount <= parts.size() && "Integer too big");

    if (category == fcNaN)
      bits = 0;
    else if (sign)
      bits = isSigned;
    else
      bits = width - isSigned;

    APInt::tcSetLeastSignificantBits(parts.data(), dstPartsCount, bits);
    if (sign && isSigned)
      APInt::tcShiftLeft(parts.data(), dstPartsCount, width - 1);
  }

  return fs;
}